

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

GLenum cgltfPrimTypeToGl(cgltf_primitive_type type)

{
  size_t sVar1;
  cgltf_primitive_type type_local;
  
  sVar1 = tl::size<unsigned_int_const,7ul>(&cgltfPrimTypeToGl::lu);
  if (type < sVar1) {
    return cgltfPrimTypeToGl::lu[type];
  }
  __assert_fail("type < tl::size(lu)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/utils.cpp"
                ,0x77,"GLenum cgltfPrimTypeToGl(cgltf_primitive_type)");
}

Assistant:

GLenum cgltfPrimTypeToGl(cgltf_primitive_type type)
{
    static const GLenum lu[] = {
        GL_POINTS,
        GL_LINES,
        GL_LINE_LOOP,
        GL_LINE_STRIP,
        GL_TRIANGLES,
        GL_TRIANGLE_STRIP,
        GL_TRIANGLE_FAN
    };
    assert(type < tl::size(lu));
    return lu[type];
}